

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O2

void __thiscall
SPTest_ConstantExprInExpectation_Test::TestBody(SPTest_ConstantExprInExpectation_Test *this)

{
  Impl *pIVar1;
  NumericConstant lhs;
  NumericConstant rhs;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  expr;
  Impl *pIVar2;
  char *message;
  AssertHelper local_620;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_618;
  AssertionResult gtest_ar;
  TestBasicProblem p;
  SPAdapter sp;
  
  TestBasicProblem::TestBasicProblem(&p,1,0);
  lhs = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                  ((BasicExprFactory<std::allocator<char>_> *)&p,6.0);
  rhs = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                  ((BasicExprFactory<std::allocator<char>_> *)&p,7.0);
  expr = mp::BasicExprFactory<std::allocator<char>>::
         MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                   ((BasicExprFactory<std::allocator<char>> *)&p,MUL,
                    (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                    lhs.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_,
                    (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                    rhs.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_);
  TestProblem::AddExpectationObj
            (&p.super_TestProblem,
             (Expr)expr.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_
            );
  mp::SPAdapter::SPAdapter(&sp,(ColProblem *)&p);
  pIVar1 = ((sp.nonlinear_objs_.
             super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->super_ExprBase).impl_;
  pIVar2 = (Impl *)0x0;
  if (pIVar1->kind_ == FIRST_EXPR) {
    pIVar2 = pIVar1;
  }
  local_620.data_._0_4_ = 0x2a;
  local_618.ptr_ =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)(pIVar2 + 2);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar,"42","constant.value()",(int *)&local_620,(double *)&local_618);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_618);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x164,
               message);
    testing::internal::AssertHelper::operator=(&local_620,(Message *)&local_618);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_618);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::SPAdapter::~SPAdapter(&sp);
  mp::ColProblem::~ColProblem((ColProblem *)&p);
  return;
}

Assistant:

TEST(SPTest, ConstantExprInExpectation) {
  TestBasicProblem p(1);
  p.AddExpectationObj(
        p.MakeBinary(expr::MUL, p.MakeNumericConstant(6),
                     p.MakeNumericConstant(7)));
  mp::SPAdapter sp(p);
  auto constant = mp::Cast<mp::NumericConstant>(sp.obj(0).nonlinear_expr());
  EXPECT_EQ(42, constant.value());
}